

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O2

void nn_req_action_send(nn_req *self,int allow_delay)

{
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  nn_pipe *to;
  nn_msg msg;
  
  nn_msg_cp(&msg,&(self->task).request);
  iVar1 = nn_xreq_send_to((nn_sockbase *)self,&msg,&to);
  if (iVar1 == 0) {
    nn_timer_start(&(self->task).timer,self->resend_ivl);
    if (to != (nn_pipe *)0x0) {
      (self->task).sent_to = to;
      iVar1 = 4;
LAB_00125dec:
      self->state = iVar1;
      return;
    }
    nn_backtrace_print();
    pcVar2 = "to";
    uVar3 = 0x273;
  }
  else {
    if (iVar1 != -0xb) {
      nn_backtrace_print();
      __stream = _stderr;
      pcVar2 = nn_err_strerror(-iVar1);
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar2,(ulong)(uint)-iVar1,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/reqrep/req.c"
              ,0x27a);
      goto LAB_00125e91;
    }
    if (allow_delay == 1) {
      nn_msg_term(&msg);
      iVar1 = 3;
      goto LAB_00125dec;
    }
    nn_backtrace_print();
    pcVar2 = "allow_delay == 1";
    uVar3 = 0x268;
  }
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar2,
          "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/reqrep/req.c"
          ,uVar3);
LAB_00125e91:
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

void nn_req_action_send (struct nn_req *self, int allow_delay)
{
    int rc;
    struct nn_msg msg;
    struct nn_pipe *to;

    /*  Send the request. */
    nn_msg_cp (&msg, &self->task.request);
    rc = nn_xreq_send_to (&self->xreq.sockbase, &msg, &to);

    /*  If the request cannot be sent at the moment wait till
        new outbound pipe arrives. */
    if (nn_slow (rc == -EAGAIN)) {
        nn_assert (allow_delay == 1);
        nn_msg_term (&msg);
        self->state = NN_REQ_STATE_DELAYED;
        return;
    }

    /*  Request was successfully sent. Set up the re-send timer
        in case the request gets lost somewhere further out
        in the topology. */
    if (nn_fast (rc == 0)) {
        nn_timer_start (&self->task.timer, self->resend_ivl);
        nn_assert (to);
        self->task.sent_to = to;
        self->state = NN_REQ_STATE_ACTIVE;
        return;
    }

    /*  Unexpected error. */
    errnum_assert (0, -rc);
}